

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O1

Mpm_Cut_t * Mpm_ManMergeCuts(Mpm_Man_t *p,Mpm_Cut_t *pCut0,Mpm_Cut_t *pCut1,Mpm_Cut_t *pCut2)

{
  void *__dest;
  undefined4 uVar1;
  void *pvVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  Mpm_Cut_t *pMVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  
  lVar3 = (long)(p->vFreeUnits).nSize;
  if (lVar3 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
  }
  pvVar2 = (p->vFreeUnits).pArray[lVar3 + -1];
  __dest = (void *)((long)pvVar2 + 0x24);
  memcpy(__dest,pCut0->pLeaves,(ulong)(*(uint *)&pCut0->field_0x4 >> 0x19 & 0xfffffffc));
  *(uint *)((long)pvVar2 + 0x20) =
       *(uint *)((long)pvVar2 + 0x20) & 0x7ffffff | *(uint *)&pCut0->field_0x4 & 0xf8000000;
  if (p->pPars->fUseDsd == 0) {
    iVar4 = 1;
    do {
      pMVar8 = pCut2;
      if (iVar4 == 1) {
        pMVar8 = pCut1;
      }
      if (pMVar8 == (Mpm_Cut_t *)0x0) break;
      if (0x7ffffff < *(uint *)&pMVar8->field_0x4) {
        uVar10 = 0;
        do {
          uVar5 = pMVar8->pLeaves[uVar10];
          if ((int)uVar5 < 0) goto LAB_0047c3b9;
          uVar9 = 0;
          if (0x7ffffff < *(uint *)((long)pvVar2 + 0x20)) {
            uVar12 = (ulong)(*(uint *)((long)pvVar2 + 0x20) >> 0x1b);
            uVar7 = 0;
            do {
              uVar11 = *(uint *)((long)__dest + uVar7 * 4);
              if ((int)uVar11 < 0) goto LAB_0047c3b9;
              uVar9 = uVar7;
            } while ((1 < (uVar11 ^ uVar5)) && (uVar7 = uVar7 + 1, uVar9 = uVar12, uVar12 != uVar7))
            ;
          }
          uVar11 = *(uint *)((long)pvVar2 + 0x20) >> 0x1b;
          if ((uint)uVar9 == uVar11) {
            if (uVar11 == p->nLutSize) {
              return (Mpm_Cut_t *)0x0;
            }
            *(uint *)((long)pvVar2 + 0x20) = *(uint *)((long)pvVar2 + 0x20) + 0x8000000;
            *(uint *)((long)pvVar2 + (ulong)uVar11 * 4 + 0x24) = uVar5;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < *(uint *)&pMVar8->field_0x4 >> 0x1b);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != 3);
  }
  else {
    lVar3 = 1;
    do {
      pMVar8 = pCut2;
      if (lVar3 == 1) {
        pMVar8 = pCut1;
      }
      if (pMVar8 == (Mpm_Cut_t *)0x0) break;
      p->uPermMask[lVar3] = 0x3ffff;
      p->uComplMask[lVar3] = 0;
      if (0x7ffffff < *(uint *)&pMVar8->field_0x4) {
        uVar10 = 0;
        do {
          uVar5 = pMVar8->pLeaves[uVar10];
          if ((int)uVar5 < 0) {
LAB_0047c3b9:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar9 = 0;
          if (0x7ffffff < *(uint *)((long)pvVar2 + 0x20)) {
            uVar12 = (ulong)(*(uint *)((long)pvVar2 + 0x20) >> 0x1b);
            uVar7 = 0;
            do {
              uVar11 = *(uint *)((long)__dest + uVar7 * 4);
              if ((int)uVar11 < 0) goto LAB_0047c3b9;
              uVar9 = uVar7;
            } while ((1 < (uVar11 ^ uVar5)) && (uVar7 = uVar7 + 1, uVar9 = uVar12, uVar12 != uVar7))
            ;
          }
          uVar11 = *(uint *)((long)pvVar2 + 0x20) >> 0x1b;
          if ((uint)uVar9 == uVar11) {
            if (uVar11 == p->nLutSize) {
              return (Mpm_Cut_t *)0x0;
            }
            *(uint *)((long)pvVar2 + 0x20) = *(uint *)((long)pvVar2 + 0x20) + 0x8000000;
            *(uint *)((long)pvVar2 + (ulong)uVar11 * 4 + 0x24) = uVar5;
          }
          p->uPermMask[lVar3] =
               p->uPermMask[lVar3] ^ (~(uint)uVar10 & 7) << ((byte)uVar9 * '\x03' & 0x1f);
          if (pMVar8->pLeaves[uVar10] != *(int *)((long)__dest + (long)(int)(uint)uVar9 * 4)) {
            p->uComplMask[lVar3] = p->uComplMask[lVar3] | 1 << ((byte)uVar9 & 0x1f);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < *(uint *)&pMVar8->field_0x4 >> 0x1b);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
  }
  ((Mpm_Cut_t *)((long)pvVar2 + 0x1c))->hNext = 0;
  if (pCut1 == (Mpm_Cut_t *)0x0) {
    uVar11 = *(uint *)&pCut0->field_0x4 & 0x1ffffff;
    uVar5 = *(uint *)((long)pvVar2 + 0x20);
    *(uint *)((long)pvVar2 + 0x20) = uVar5 & 0xfe000000 | uVar11;
    uVar6 = *(uint *)&pCut0->field_0x4 & 0x4000000;
    *(uint *)((long)pvVar2 + 0x20) = uVar5 & 0xfa000000 | uVar11 | uVar6;
    uVar5 = uVar5 & 0xf8000000 | uVar11 | uVar6 | *(uint *)&pCut0->field_0x4 & 0x2000000;
  }
  else {
    uVar5 = *(uint *)((long)pvVar2 + 0x20) & 0xf8000000 | 0x1ffffff;
  }
  *(uint *)((long)pvVar2 + 0x20) = uVar5;
  p->nCutsMerged = p->nCutsMerged + 1;
  p->nCutsMergedAll = p->nCutsMergedAll + 1;
  if ((p->pPars->fUseTruth != 0) && (0xfffffff < *(uint *)((long)pvVar2 + 0x20))) {
    uVar5 = *(uint *)((long)pvVar2 + 0x20) >> 0x1b;
    uVar9 = (ulong)uVar5;
    lVar3 = (long)pvVar2 + 0x28;
    iVar4 = 1;
    uVar10 = 0;
    do {
      uVar9 = uVar9 - 1;
      uVar7 = 0;
      uVar12 = uVar10 & 0xffffffff;
      do {
        if (*(int *)(lVar3 + uVar7 * 4) < *(int *)((long)__dest + (long)(int)uVar12 * 4)) {
          uVar12 = (ulong)(uint)(iVar4 + (int)uVar7);
        }
        uVar7 = uVar7 + 1;
      } while (uVar9 != uVar7);
      uVar1 = *(undefined4 *)((long)__dest + uVar10 * 4);
      *(undefined4 *)((long)__dest + uVar10 * 4) =
           *(undefined4 *)((long)__dest + (long)(int)uVar12 * 4);
      uVar10 = uVar10 + 1;
      *(undefined4 *)((long)__dest + (long)(int)uVar12 * 4) = uVar1;
      iVar4 = iVar4 + 1;
      lVar3 = lVar3 + 4;
    } while (uVar10 != uVar5 - 1);
  }
  return (Mpm_Cut_t *)((long)pvVar2 + 0x1c);
}

Assistant:

static inline Mpm_Cut_t * Mpm_ManMergeCuts( Mpm_Man_t * p, Mpm_Cut_t * pCut0, Mpm_Cut_t * pCut1, Mpm_Cut_t * pCut2 )
{
    Mpm_Cut_t * pTemp, * pCut = &((Mpm_Uni_t *)Vec_PtrEntryLast(&p->vFreeUnits))->pCut;
    int i, c, iPlace;
    // base cut
    memcpy( pCut->pLeaves, pCut0->pLeaves, sizeof(int) * pCut0->nLeaves );
    pCut->nLeaves = pCut0->nLeaves;
    // remaining cuts
    if ( p->pPars->fUseDsd )
    {
        for ( c = 1; c < 3; c++ )
        {
            pTemp = (c == 1) ? pCut1 : pCut2;
            if ( pTemp == NULL )
                break;
            p->uPermMask[c] = 0x3FFFF; // 18 bits
            p->uComplMask[c] = 0;     
            for ( i = 0; i < (int)pTemp->nLeaves; i++ )
            {
                iPlace = Mpm_CutFindLeaf( pCut, Abc_Lit2Var(pTemp->pLeaves[i]) );
                if ( iPlace == (int)pCut->nLeaves )
                {
                    if ( (int)pCut->nLeaves == p->nLutSize )
                        return NULL;
                    pCut->pLeaves[pCut->nLeaves++] = pTemp->pLeaves[i];
                }
                p->uPermMask[c] ^= (((i & 7) ^ 7) << (3*iPlace));
                if ( pTemp->pLeaves[i] != pCut->pLeaves[iPlace] )
                    p->uComplMask[c] |= (1 << iPlace);
            }
        }
    }
    else
    {
        for ( c = 1; c < 3; c++ )
        {
            pTemp = (c == 1) ? pCut1 : pCut2;
            if ( pTemp == NULL )
                break;
            for ( i = 0; i < (int)pTemp->nLeaves; i++ )
            {
                iPlace = Mpm_CutFindLeaf( pCut, Abc_Lit2Var(pTemp->pLeaves[i]) );
                if ( iPlace == (int)pCut->nLeaves )
                {
                    if ( (int)pCut->nLeaves == p->nLutSize )
                        return NULL;
                    pCut->pLeaves[pCut->nLeaves++] = pTemp->pLeaves[i];
                }
            }
        }
    }
    if ( pCut1 == NULL )
    {
        pCut->hNext    = 0;
        pCut->iFunc    = pCut0->iFunc;
        pCut->fUseless = pCut0->fUseless;
        pCut->fCompl   = pCut0->fCompl;
    }
    else
    {
        pCut->hNext    = 0;
        pCut->iFunc    = 0;  pCut->iFunc = ~pCut->iFunc;
        pCut->fUseless = 0;
        pCut->fCompl   = 0;
    }
    p->nCutsMerged++;
    p->nCutsMergedAll++;
    if ( p->pPars->fUseTruth )
        Vec_IntSelectSort( pCut->pLeaves, pCut->nLeaves );
    return pCut;
}